

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaUtil.c
# Opt level: O0

char * Ioa_FileNameGenericAppend(char *pBase,char *pSuffix)

{
  char *pcVar1;
  size_t sVar2;
  char *local_28;
  char *pDot;
  char *pSuffix_local;
  char *pBase_local;
  
  if (pBase == (char *)0x0) {
    strcpy(Ioa_FileNameGenericAppend::Buffer,pSuffix);
    pBase_local = Ioa_FileNameGenericAppend::Buffer;
  }
  else {
    strcpy(Ioa_FileNameGenericAppend::Buffer,pBase);
    pcVar1 = strrchr(Ioa_FileNameGenericAppend::Buffer,0x2e);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    strcat(Ioa_FileNameGenericAppend::Buffer,pSuffix);
    sVar2 = strlen(Ioa_FileNameGenericAppend::Buffer);
    for (local_28 = &DAT_0120918f + sVar2;
        (&DAT_0120918f < local_28 &&
        ((((('/' < *local_28 && (*local_28 < ':')) || (('`' < *local_28 && (*local_28 < '{')))) ||
          ((('@' < *local_28 && (*local_28 < '[')) || (*local_28 == '_')))) || (*local_28 == '.'))))
        ; local_28 = local_28 + -1) {
    }
    pBase_local = local_28 + 1;
  }
  return pBase_local;
}

Assistant:

char * Ioa_FileNameGenericAppend( char * pBase, char * pSuffix )
{
    static char Buffer[1000];
    char * pDot;
    if ( pBase == NULL )
    {
        strcpy( Buffer, pSuffix );
        return Buffer;
    }
    strcpy( Buffer, pBase );
    if ( (pDot = strrchr( Buffer, '.' )) )
        *pDot = 0;
    strcat( Buffer, pSuffix );
    // find the last occurrance of slash
    for ( pDot = Buffer + strlen(Buffer) - 1; pDot >= Buffer; pDot-- )    
        if (!((*pDot >= '0' && *pDot <= '9') ||
              (*pDot >= 'a' && *pDot <= 'z') ||
              (*pDot >= 'A' && *pDot <= 'Z') || 
               *pDot == '_' || *pDot == '.') )
               break;
    return pDot + 1;
}